

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

WasmConstLitNode __thiscall
Js::WebAssemblyEnvironment::GetGlobalValue(WebAssemblyEnvironment *this,WasmGlobal *global)

{
  code *pcVar1;
  anon_union_16_5_ffed0461_for_WasmConstLitNode_0 aVar2;
  bool bVar3;
  uint offset_00;
  WasmType WVar4;
  undefined4 *puVar5;
  WebAssemblyModule *this_00;
  long lVar6;
  double dVar7;
  uint32 offset;
  WasmGlobal *global_local;
  WebAssemblyEnvironment *this_local;
  WasmConstLitNode cnst;
  
  if (global == (WasmGlobal *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0x99,"(global)","global");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
  offset_00 = WebAssemblyModule::GetOffsetForGlobal(this_00,global);
  WVar4 = Wasm::WasmGlobal::GetType(global);
  switch(WVar4) {
  case FirstLocalType:
    this_local._0_4_ = (float)GetGlobalInternal<int>(this,offset_00);
    break;
  case I64:
    lVar6 = GetGlobalInternal<long>(this,offset_00);
    this_local._0_4_ = (float)lVar6;
    this_local._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
    break;
  case F32:
    this_local._0_4_ = GetGlobalInternal<float>(this,offset_00);
    break;
  case F64:
    dVar7 = GetGlobalInternal<double>(this,offset_00);
    this_local._0_4_ = SUB84(dVar7,0);
    this_local._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case V128:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xa4,"((0))","Wasm.Simd globals not supported");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  default:
    Wasm::WasmTypes::
    CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
  }
  aVar2.v128[1] = this_local._4_4_;
  aVar2.f32 = this_local._0_4_;
  aVar2._8_8_ = cnst.field_0.i64;
  return (WasmConstLitNode)aVar2;
}

Assistant:

Wasm::WasmConstLitNode WebAssemblyEnvironment::GetGlobalValue(Wasm::WasmGlobal* global) const
{
    AssertOrFailFast(global);
    Wasm::WasmConstLitNode cnst;
    uint32 offset = module->GetOffsetForGlobal(global);

    switch (global->GetType())
    {
    case Wasm::WasmTypes::I32: cnst.i32 = GetGlobalInternal<int>(offset); break;
    case Wasm::WasmTypes::I64: cnst.i64 = GetGlobalInternal<int64>(offset); break;
    case Wasm::WasmTypes::F32: cnst.f32 = GetGlobalInternal<float>(offset); break;
    case Wasm::WasmTypes::F64: cnst.f64 = GetGlobalInternal<double>(offset); break;
#ifdef ENABLE_WASM_SIMD
    case Wasm::WasmTypes::V128: AssertOrFailFastMsg(UNREACHED, "Wasm.Simd globals not supported");
#endif
    default:
        Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
    }
    return cnst;
}